

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

int64 Js::JavascriptArray::GetIndexFromVar(Var arg,int64 length,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong extraout_RAX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double T1;
  
  if (((ulong)arg & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b7f828;
    *puVar3 = 0;
  }
  if (((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)arg & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00b7f828:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    uVar5 = (int)arg + length;
    uVar6 = 0;
    if (0 < (long)uVar5) {
      uVar6 = uVar5;
    }
    uVar4 = (ulong)arg & 0xffffffff;
    if ((int)arg < 0) {
      uVar4 = uVar6;
    }
    if (length <= (long)uVar4) {
      uVar4 = length;
    }
  }
  else {
    T1 = JavascriptConversion::ToInteger_Full(arg,scriptContext);
    uVar5 = extraout_RAX;
    if ((T1 <= (double)length) &&
       (uVar4 = NumberUtilities::TryToInt64(T1), uVar5 = uVar4, (long)uVar4 < 0)) {
      uVar5 = uVar4 + length;
      if ((long)(uVar4 + length) < 1) {
        uVar5 = 0;
      }
    }
    uVar4 = length;
    if (T1 <= (double)length) {
      uVar4 = uVar5;
    }
  }
  return uVar4;
}

Assistant:

int64 JavascriptArray::GetIndexFromVar(Js::Var arg, int64 length, ScriptContext* scriptContext)
    {
        int64 index;

        if (TaggedInt::Is(arg))
        {
            int intValue = TaggedInt::ToInt32(arg);

            if (intValue < 0)
            {
                index = max<int64>(0, length + intValue);
            }
            else
            {
                index = intValue;
            }

            if (index > length)
            {
                index = length;
            }
        }
        else
        {
            double doubleValue = JavascriptConversion::ToInteger(arg, scriptContext);

            // Handle the Number.POSITIVE_INFINITY case
            if (doubleValue > length)
            {
                return length;
            }

            index = NumberUtilities::TryToInt64(doubleValue);

            if (index < 0)
            {
                index = max<int64>(0, index + length);
            }
        }

        return index;
    }